

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O0

char * __thiscall llbuild::basic::sys::strerror_abi_cxx11_(sys *this,int __errnum)

{
  char *pcVar1;
  allocator local_15;
  int local_14;
  sys *psStack_10;
  int error_local;
  
  local_14 = __errnum;
  psStack_10 = this;
  pcVar1 = ::strerror(__errnum);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,&local_15);
  std::allocator<char>::~allocator((allocator<char> *)&local_15);
  return (char *)this;
}

Assistant:

std::string sys::strerror(int error) {
#if defined(_WIN32)
  LPWSTR errBuff;
  int count = FormatMessageW(FORMAT_MESSAGE_FROM_SYSTEM |
                                 FORMAT_MESSAGE_ALLOCATE_BUFFER |
                                 FORMAT_MESSAGE_IGNORE_INSERTS,
                             nullptr, error, 0, (LPWSTR)&errBuff, 0, nullptr);
  llvm::ArrayRef<wchar_t> wRef(errBuff, errBuff + count);
  llvm::ArrayRef<char> uRef(reinterpret_cast<const char *>(wRef.begin()),
                            reinterpret_cast<const char *>(wRef.end()));
  std::string utf8Err;
  llvm::convertUTF16ToUTF8String(llvm::ArrayRef<char>(uRef), utf8Err);
  LocalFree(errBuff);
  return utf8Err;
#else
  return ::strerror(error);
#endif
}